

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O2

void __thiscall
Eigen::internal::
gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,_0,_false,_false>
::operator()(gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,_0,_false,_false>
             *this,double *blockA,const_blas_data_mapper<double,_long,_0> *lhs,long depth,long rows,
            long stride,long offset)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  double *pdVar6;
  long lVar7;
  ulong uVar8;
  long k;
  long lVar9;
  long lVar10;
  bool bVar11;
  
  if (stride == 0 && offset == 0) {
    lVar5 = 0;
    if (depth < 1) {
      depth = lVar5;
    }
    lVar7 = 0;
    for (uVar8 = 0; (long)uVar8 < (rows / 4) * 4; uVar8 = uVar8 + 4) {
      for (lVar9 = 0; depth != lVar9; lVar9 = lVar9 + 1) {
        lVar10 = (lhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_stride * lVar9;
        pdVar1 = (lhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data;
        pdVar6 = pdVar1 + lVar10 + uVar8;
        dVar2 = pdVar6[1];
        pdVar1 = pdVar1 + lVar10 + (uVar8 | 2);
        dVar3 = *pdVar1;
        dVar4 = pdVar1[1];
        blockA[lVar7] = *pdVar6;
        (blockA + lVar7)[1] = dVar2;
        blockA[lVar7 + 2] = dVar3;
        (blockA + lVar7 + 2)[1] = dVar4;
        lVar7 = lVar7 + 4;
      }
      lVar5 = lVar5 + 0x20;
    }
    for (; SBORROW8(uVar8,(rows / 2) * 2) != (long)(uVar8 + (rows / 2) * -2) < 0; uVar8 = uVar8 + 2)
    {
      for (lVar9 = 0; depth != lVar9; lVar9 = lVar9 + 1) {
        pdVar6 = (lhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data +
                 (lhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_stride * lVar9 + uVar8;
        dVar2 = pdVar6[1];
        blockA[lVar7] = *pdVar6;
        (blockA + lVar7)[1] = dVar2;
        lVar7 = lVar7 + 2;
      }
      lVar5 = lVar5 + 0x10;
    }
    for (; (long)uVar8 < rows; uVar8 = uVar8 + 1) {
      lVar9 = (lhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_stride;
      pdVar6 = (double *)
               ((long)(lhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data + lVar5);
      lVar10 = depth;
      while (bVar11 = lVar10 != 0, lVar10 = lVar10 + -1, bVar11) {
        blockA[lVar7] = *pdVar6;
        lVar7 = lVar7 + 1;
        pdVar6 = pdVar6 + lVar9;
      }
      lVar5 = lVar5 + 8;
    }
    return;
  }
  __assert_fail("((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/products/GeneralBlockPanelKernel.h"
                ,0x6b0,
                "void Eigen::internal::gemm_pack_lhs<double, long, Eigen::internal::const_blas_data_mapper<double, long, 0>, 4, 2, 0>::operator()(Scalar *, const DataMapper &, Index, Index, Index, Index) [Scalar = double, Index = long, DataMapper = Eigen::internal::const_blas_data_mapper<double, long, 0>, Pack1 = 4, Pack2 = 2, StorageOrder = 0, Conjugate = false, PanelMode = false]"
               );
}

Assistant:

EIGEN_DONT_INLINE void gemm_pack_lhs<Scalar, Index, DataMapper, Pack1, Pack2, ColMajor, Conjugate, PanelMode>
  ::operator()(Scalar* blockA, const DataMapper& lhs, Index depth, Index rows, Index stride, Index offset)
{
  typedef typename packet_traits<Scalar>::type Packet;
  enum { PacketSize = packet_traits<Scalar>::size };

  EIGEN_ASM_COMMENT("EIGEN PRODUCT PACK LHS");
  EIGEN_UNUSED_VARIABLE(stride);
  EIGEN_UNUSED_VARIABLE(offset);
  eigen_assert(((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride));
  eigen_assert( ((Pack1%PacketSize)==0 && Pack1<=4*PacketSize) || (Pack1<=4) );
  conj_if<NumTraits<Scalar>::IsComplex && Conjugate> cj;
  Index count = 0;

  const Index peeled_mc3 = Pack1>=3*PacketSize ? (rows/(3*PacketSize))*(3*PacketSize) : 0;
  const Index peeled_mc2 = Pack1>=2*PacketSize ? peeled_mc3+((rows-peeled_mc3)/(2*PacketSize))*(2*PacketSize) : 0;
  const Index peeled_mc1 = Pack1>=1*PacketSize ? (rows/(1*PacketSize))*(1*PacketSize) : 0;
  const Index peeled_mc0 = Pack2>=1*PacketSize ? peeled_mc1
                         : Pack2>1             ? (rows/Pack2)*Pack2 : 0;

  Index i=0;

  // Pack 3 packets
  if(Pack1>=3*PacketSize)
  {
    for(; i<peeled_mc3; i+=3*PacketSize)
    {
      if(PanelMode) count += (3*PacketSize) * offset;

      for(Index k=0; k<depth; k++)
      {
        Packet A, B, C;
        A = lhs.loadPacket(i+0*PacketSize, k);
        B = lhs.loadPacket(i+1*PacketSize, k);
        C = lhs.loadPacket(i+2*PacketSize, k);
        pstore(blockA+count, cj.pconj(A)); count+=PacketSize;
        pstore(blockA+count, cj.pconj(B)); count+=PacketSize;
        pstore(blockA+count, cj.pconj(C)); count+=PacketSize;
      }
      if(PanelMode) count += (3*PacketSize) * (stride-offset-depth);
    }
  }
  // Pack 2 packets
  if(Pack1>=2*PacketSize)
  {
    for(; i<peeled_mc2; i+=2*PacketSize)
    {
      if(PanelMode) count += (2*PacketSize) * offset;

      for(Index k=0; k<depth; k++)
      {
        Packet A, B;
        A = lhs.loadPacket(i+0*PacketSize, k);
        B = lhs.loadPacket(i+1*PacketSize, k);
        pstore(blockA+count, cj.pconj(A)); count+=PacketSize;
        pstore(blockA+count, cj.pconj(B)); count+=PacketSize;
      }
      if(PanelMode) count += (2*PacketSize) * (stride-offset-depth);
    }
  }
  // Pack 1 packets
  if(Pack1>=1*PacketSize)
  {
    for(; i<peeled_mc1; i+=1*PacketSize)
    {
      if(PanelMode) count += (1*PacketSize) * offset;

      for(Index k=0; k<depth; k++)
      {
        Packet A;
        A = lhs.loadPacket(i+0*PacketSize, k);
        pstore(blockA+count, cj.pconj(A));
        count+=PacketSize;
      }
      if(PanelMode) count += (1*PacketSize) * (stride-offset-depth);
    }
  }
  // Pack scalars
  if(Pack2<PacketSize && Pack2>1)
  {
    for(; i<peeled_mc0; i+=Pack2)
    {
      if(PanelMode) count += Pack2 * offset;

      for(Index k=0; k<depth; k++)
        for(Index w=0; w<Pack2; w++)
          blockA[count++] = cj(lhs(i+w, k));

      if(PanelMode) count += Pack2 * (stride-offset-depth);
    }
  }
  for(; i<rows; i++)
  {
    if(PanelMode) count += offset;
    for(Index k=0; k<depth; k++)
      blockA[count++] = cj(lhs(i, k));
    if(PanelMode) count += (stride-offset-depth);
  }
}